

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peerman_args.cpp
# Opt level: O0

void node::ApplyArgsManOptions(ArgsManager *argsman,Options *options)

{
  bool bVar1;
  _Optional_payload_base<bool> _Var2;
  uint uVar3;
  _Storage<long,_true> this;
  long *plVar4;
  bool *pbVar5;
  undefined1 uVar6;
  byte *in_RSI;
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  optional<long> oVar7;
  optional<bool> value_4;
  optional<bool> value_3;
  optional<bool> value;
  optional<long> value_2;
  optional<long> value_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  undefined6 in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe4e;
  long *in_stack_fffffffffffffe50;
  long *in_stack_fffffffffffffe58;
  undefined6 in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe66;
  ArgsManager *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  allocator<char> local_fe;
  _Optional_payload_base<bool> local_fd;
  allocator<char> local_fb;
  _Optional_payload_base<bool> local_fa;
  ulong local_f8;
  undefined8 local_f0;
  allocator<char> local_e1;
  ulong local_e0;
  undefined8 local_d8;
  allocator<char> local_cc;
  allocator<char> local_cb;
  _Optional_payload_base<bool> local_ca;
  _Storage<long,_true> local_c8;
  undefined1 local_c0;
  _Storage<long,_true> local_b8;
  undefined1 local_b0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (allocator<char> *)in_stack_fffffffffffffe78);
  local_ca = (_Optional_payload_base<bool>)
             ArgsManager::GetBoolArg
                       (in_stack_fffffffffffffe68,
                        (string *)CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60));
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator(&local_cb);
  bVar1 = std::optional::operator_cast_to_bool((optional<bool> *)in_stack_fffffffffffffe38);
  if (bVar1) {
    pbVar5 = std::optional<bool>::operator*((optional<bool> *)in_stack_fffffffffffffe38);
    in_RSI[1] = *pbVar5 & 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (allocator<char> *)in_stack_fffffffffffffe78);
  oVar7 = ArgsManager::GetIntArg
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe78);
  local_b8._M_value =
       oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  local_b0 = oVar7.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator(&local_cc);
  bVar1 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_fffffffffffffe38);
  if (bVar1) {
    std::optional<long>::operator*((optional<long> *)in_stack_fffffffffffffe38);
    local_d8 = 0;
    uVar3 = std::numeric_limits<unsigned_int>::max();
    local_e0 = (ulong)uVar3;
    plVar4 = std::clamp<long>(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              (long *)CONCAT26(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48))
    ;
    *(int *)(in_RSI + 4) = (int)*plVar4;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (allocator<char> *)in_stack_fffffffffffffe78);
  oVar7 = ArgsManager::GetIntArg
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe78);
  this._M_value =
       oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  uVar6 = oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
          ._M_engaged;
  local_c8._M_value = this._M_value;
  local_c0 = uVar6;
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator(&local_e1);
  bVar1 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_fffffffffffffe38);
  if (bVar1) {
    in_stack_fffffffffffffe78 =
         (string *)std::optional<long>::operator*((optional<long> *)in_stack_fffffffffffffe38);
    local_f0 = 0;
    uVar3 = std::numeric_limits<unsigned_int>::max();
    local_f8 = (ulong)uVar3;
    plVar4 = std::clamp<long>(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              (long *)CONCAT26(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48))
    ;
    *(int *)(in_RSI + 8) = (int)*plVar4;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)CONCAT17(uVar6,in_stack_fffffffffffffe80),
             (allocator<char> *)in_stack_fffffffffffffe78);
  _Var2 = (_Optional_payload_base<bool>)
          ArgsManager::GetBoolArg
                    (in_RDI,(string *)CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60))
  ;
  local_fa = _Var2;
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator(&local_fb);
  bVar1 = std::optional::operator_cast_to_bool((optional<bool> *)in_stack_fffffffffffffe38);
  if (bVar1) {
    pbVar5 = std::optional<bool>::operator*((optional<bool> *)in_stack_fffffffffffffe38);
    in_RSI[0xc] = *pbVar5 & 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)CONCAT17(uVar6,in_stack_fffffffffffffe80),
             (allocator<char> *)in_stack_fffffffffffffe78);
  local_fd = (_Optional_payload_base<bool>)
             ArgsManager::GetBoolArg(in_RDI,(string *)CONCAT26(_Var2,in_stack_fffffffffffffe60));
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator(&local_fe);
  bVar1 = std::optional::operator_cast_to_bool((optional<bool> *)in_stack_fffffffffffffe38);
  if (bVar1) {
    pbVar5 = std::optional<bool>::operator*((optional<bool> *)in_stack_fffffffffffffe38);
    *in_RSI = *pbVar5 & 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ApplyArgsManOptions(const ArgsManager& argsman, PeerManager::Options& options)
{
    if (auto value{argsman.GetBoolArg("-txreconciliation")}) options.reconcile_txs = *value;

    if (auto value{argsman.GetIntArg("-maxorphantx")}) {
        options.max_orphan_txs = uint32_t((std::clamp<int64_t>(*value, 0, std::numeric_limits<uint32_t>::max())));
    }

    if (auto value{argsman.GetIntArg("-blockreconstructionextratxn")}) {
        options.max_extra_txs = uint32_t((std::clamp<int64_t>(*value, 0, std::numeric_limits<uint32_t>::max())));
    }

    if (auto value{argsman.GetBoolArg("-capturemessages")}) options.capture_messages = *value;

    if (auto value{argsman.GetBoolArg("-blocksonly")}) options.ignore_incoming_txs = *value;
}